

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O0

int nni_asprintf(char **sp,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *local_48;
  char *s;
  size_t len;
  va_list ap;
  char *fmt_local;
  char **sp_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  len._4_4_ = 0x30;
  len._0_4_ = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  ap[0].reg_save_area = fmt;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&len);
  s = (char *)((long)iVar1 + 1);
  local_48 = (char *)nni_alloc((size_t)s);
  if (local_48 == (char *)0x0) {
    sp_local._4_4_ = 2;
  }
  else {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    len._4_4_ = 0x30;
    len._0_4_ = 0x10;
    vsnprintf(local_48,(size_t)s,(char *)ap[0].reg_save_area,&len);
    *sp = local_48;
    sp_local._4_4_ = 0;
  }
  return sp_local._4_4_;
}

Assistant:

int
nni_asprintf(char **sp, const char *fmt, ...)
{
	va_list ap;
	size_t  len;
	char *  s;

	va_start(ap, fmt);
	len = vsnprintf(NULL, 0, fmt, ap);
	va_end(ap);
	len++;

	if ((s = nni_alloc(len)) == NULL) {
		return (NNG_ENOMEM);
	}
	va_start(ap, fmt);
	(void) vsnprintf(s, len, fmt, ap);
	va_end(ap);
	*sp = s;
	return (0);
}